

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_world.cc
# Opt level: O2

bool __thiscall
sptk::AperiodicityExtractionByWorld::Run
          (AperiodicityExtractionByWorld *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  double *pdVar6;
  int i;
  vector<double,_std::allocator<double>_> *vector;
  ulong uVar7;
  pointer pvVar8;
  size_type __new_size;
  size_type __n;
  int f0_length;
  ulong uVar9;
  long lVar10;
  D4COption option;
  vector<double_*,_std::allocator<double_*>_> pointers;
  pointer local_50;
  vector<double,_std::allocator<double>_> time_axis;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    pdVar3 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (aperiodicity !=
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0 && pdVar3 != pdVar4) {
      uVar9 = (ulong)((long)pdVar4 - (long)pdVar3) >> 3;
      dVar1 = this->sampling_rate_;
      f0_length = (int)uVar9;
      uVar7 = 0;
      if (0 < f0_length) {
        uVar7 = uVar9 & 0xffffffff;
      }
      uVar9 = 0;
      do {
        if (uVar7 == uVar9) {
          iVar2 = this->frame_shift_;
          __n = (size_type)f0_length;
          std::vector<double,_std::allocator<double>_>::vector
                    (&time_axis,__n,(allocator_type *)&pointers);
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] = (double)(int)uVar9 * ((double)iVar2 / dVar1);
          }
          world::InitializeD4COption(&option);
          option.threshold = 0.0;
          if (((long)(aperiodicity->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(aperiodicity->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x18 != __n) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::resize(aperiodicity,__n);
          }
          __new_size = (size_type)(this->fft_length_ / 2 + 1);
          for (lVar10 = 0; uVar7 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
            pvVar8 = (aperiodicity->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (*(long *)((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar10 + 8) -
                *(long *)((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar10) >> 3 != __new_size) {
              std::vector<double,_std::allocator<double>_>::resize
                        ((vector<double,_std::allocator<double>_> *)
                         ((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar10),__new_size);
            }
          }
          pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<double_*,_std::allocator<double_*>_>::reserve(&pointers,__n);
          pvVar5 = (aperiodicity->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar8 = (aperiodicity->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar5;
              pvVar8 = pvVar8 + 1) {
            local_50 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            std::vector<double*,std::allocator<double*>>::emplace_back<double*>
                      ((vector<double*,std::allocator<double*>> *)&pointers,&local_50);
          }
          pdVar6 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          world::D4C(pdVar6,(int)((ulong)((long)(waveform->
                                                super__Vector_base<double,_std::allocator<double>_>)
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pdVar6) >> 3),(int)this->sampling_rate_,
                     time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,f0_length,this->fft_length_,&option,
                     pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
          std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
                    (&pointers.super__Vector_base<double_*,_std::allocator<double_*>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&time_axis.super__Vector_base<double,_std::allocator<double>_>);
          return true;
        }
        pdVar6 = pdVar3 + uVar9;
      } while ((0.0 <= *pdVar6) && (uVar9 = uVar9 + 1, *pdVar6 <= dVar1 * 0.5));
    }
  }
  return false;
}

Assistant:

bool AperiodicityExtractionByWorld::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty() || f0.empty() || NULL == aperiodicity) {
    return false;
  }

  // Check F0 values to prevent segmentation fault.
  const int f0_length(static_cast<int>(f0.size()));
  const double nyquist_frequency(0.5 * sampling_rate_);
  for (int i(0); i < f0_length; ++i) {
    if (f0[i] < 0.0 || nyquist_frequency < f0[i]) {
      return false;
    }
  }

  const double frame_shift_in_sec(frame_shift_ / sampling_rate_);
  std::vector<double> time_axis(f0_length);
  for (int i(0); i < f0_length; ++i) {
    time_axis[i] = i * frame_shift_in_sec;
  }

  world::D4COption option;
  world::InitializeD4COption(&option);
  option.threshold = 0.0;

  // Prepare memories.
  if (aperiodicity->size() != static_cast<std::size_t>(f0_length)) {
    aperiodicity->resize(f0_length);
  }
  const int length(fft_length_ / 2 + 1);
  for (int i(0); i < f0_length; ++i) {
    if ((*aperiodicity)[i].size() != static_cast<std::size_t>(length)) {
      (*aperiodicity)[i].resize(length);
    }
  }

  std::vector<double*> pointers;
  pointers.reserve(f0_length);
  for (std::vector<double>& vector : *aperiodicity) {
    pointers.push_back(vector.data());
  }

  world::D4C(waveform.data(), static_cast<int>(waveform.size()),
             static_cast<int>(sampling_rate_), time_axis.data(), f0.data(),
             f0_length, fft_length_, &option, pointers.data());

  return true;
}